

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_122557b::AV1ResizeXTest_DISABLED_SpeedTest_Test::TestBody
          (AV1ResizeXTest_DISABLED_SpeedTest_Test *this)

{
  AV1ResizeXTest *in_stack_00000090;
  
  AV1ResizeXTest::SpeedTest(in_stack_00000090);
  return;
}

Assistant:

TEST_P(AV1ResizeXTest, DISABLED_SpeedTest) { SpeedTest(); }